

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall
Fl_Text_Selection::update(Fl_Text_Selection *this,int pos,int nDeleted,int nInserted)

{
  int nInserted_local;
  int nDeleted_local;
  int pos_local;
  Fl_Text_Selection *this_local;
  
  if (((this->mSelected & 1U) != 0) && (pos <= this->mEnd)) {
    if (this->mStart < pos + nDeleted) {
      if ((this->mStart < pos) || (pos + nDeleted < this->mEnd)) {
        if ((this->mStart < pos) || (this->mEnd <= pos + nDeleted)) {
          if ((pos < this->mEnd) &&
             (this->mEnd = (nInserted - nDeleted) + this->mEnd, this->mEnd <= this->mStart)) {
            this->mSelected = false;
          }
        }
        else {
          this->mStart = pos;
          this->mEnd = (nInserted + this->mEnd) - nDeleted;
        }
      }
      else {
        this->mStart = pos;
        this->mEnd = pos;
        this->mSelected = false;
      }
    }
    else {
      this->mStart = (nInserted - nDeleted) + this->mStart;
      this->mEnd = (nInserted - nDeleted) + this->mEnd;
    }
  }
  return;
}

Assistant:

void Fl_Text_Selection::update(int pos, int nDeleted, int nInserted)
{
  if (!mSelected || pos > mEnd)
    return;
  if (pos + nDeleted <= mStart) {
    mStart += nInserted - nDeleted;
    mEnd += nInserted - nDeleted;
  } else if (pos <= mStart && pos + nDeleted >= mEnd) {
    mStart = pos;
    mEnd = pos;
    mSelected = 0;
  } else if (pos <= mStart && pos + nDeleted < mEnd) {
    mStart = pos;
    mEnd = nInserted + mEnd - nDeleted;
  } else if (pos < mEnd) {
    mEnd += nInserted - nDeleted;
    if (mEnd <= mStart)
      mSelected = 0;
  }
}